

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::~Vector
          (Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this)

{
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar1;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar2;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar3;
  ArrayDisposer *pAVar4;
  
  pMVar1 = (this->builder).ptr;
  if (pMVar1 != (Maybe<kj::Own<capnp::ClientHook>_> *)0x0) {
    pRVar2 = (this->builder).pos;
    pMVar3 = (this->builder).endPtr;
    (this->builder).ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    (this->builder).pos = (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
    (this->builder).endPtr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    pAVar4 = (this->builder).disposer;
    (*(code *)**(undefined8 **)pAVar4)
              (pAVar4,pMVar1,0x10,(long)pRVar2 - (long)pMVar1 >> 4,(long)pMVar3 - (long)pMVar1 >> 4,
               ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }